

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O1

EventMeta *
rlib::midi::EventMeta::createText(EventMeta *__return_storage_ptr__,Type type,string *text)

{
  long lVar1;
  uchar *puVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uchar local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (long)text->_M_string_length) {
    puVar2 = (uchar *)(text->_M_dataplus)._M_p;
    lVar1 = text->_M_string_length + 1;
    do {
      local_49 = *puVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_48,&local_49);
      puVar2 = puVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  (__return_storage_ptr__->super_Event)._vptr_Event = (_func_int **)&PTR__EventMeta_0016ac78;
  __return_storage_ptr__->type = type;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

static EventMeta createText(Type type,const std::string &text) {
			// TODO: ココで type のチェックを
			std::vector<uint8_t> data;
			std::copy(text.begin(), text.end(), std::back_inserter(data));
			return EventMeta(type, std::move(data));
		}